

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isSeamlessLinearCompareResultValid
               (TextureCubeView *texture,int levelNdx,Sampler *sampler,TexComparePrecision *prec,
               CubeFaceFloatCoords *coords,float cmpReference,float result)

{
  CubeFace CVar1;
  CompareMode compareMode;
  ulong uVar2;
  bool isFixedPointDepth_00;
  bool bVar3;
  int dim;
  int iVar4;
  int iVar5;
  deInt32 dVar6;
  deInt32 dVar7;
  ConstPixelBufferAccess *pCVar8;
  TextureFormat *format;
  float *pfVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  CubeFaceIntCoords CVar13;
  ConstPixelBufferAccess *local_270;
  Vector<float,_2> local_268;
  Vector<float,_2> local_260;
  undefined1 local_258 [8];
  Vec4 depths;
  float maxB;
  float minB;
  float maxA;
  float minA;
  CubeFace local_230;
  Vector<int,_2> local_228;
  CubeFaceCoords<int> local_220;
  undefined8 local_214;
  CubeFaceIntCoords c11;
  CubeFace local_200;
  Vector<int,_2> local_1f4;
  CubeFaceCoords<int> local_1ec;
  undefined8 local_1e0;
  CubeFaceIntCoords c01;
  CubeFace local_1c8;
  Vector<int,_2> local_1bc;
  CubeFaceCoords<int> local_1b4;
  undefined8 local_1a8;
  CubeFaceIntCoords c10;
  CubeFace local_190;
  Vector<int,_2> local_184;
  CubeFaceCoords<int> local_17c;
  undefined8 local_170;
  CubeFaceIntCoords c00;
  int i;
  int j;
  int face;
  ConstPixelBufferAccess faces [6];
  int maxJ;
  int minJ;
  int maxI;
  int minI;
  Vec2 vBounds;
  Vec2 uBounds;
  int size;
  bool isFixedPointDepth;
  float result_local;
  float cmpReference_local;
  CubeFaceFloatCoords *coords_local;
  TexComparePrecision *prec_local;
  Sampler *sampler_local;
  int levelNdx_local;
  TextureCubeView *texture_local;
  
  pCVar8 = TextureCubeView::getLevelFace(texture,levelNdx,CUBEFACE_NEGATIVE_X);
  format = ConstPixelBufferAccess::getFormat(pCVar8);
  isFixedPointDepth_00 = isFixedPointDepthTextureFormat(format);
  pCVar8 = TextureCubeView::getLevelFace(texture,levelNdx,coords->face);
  dim = ConstPixelBufferAccess::getWidth(pCVar8);
  bVar3 = sampler->normalizedCoords;
  fVar10 = coords->s;
  iVar4 = Vector<int,_3>::x(&prec->coordBits);
  iVar5 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds,(bool)(bVar3 & 1),dim,fVar10,iVar4,iVar5);
  bVar3 = sampler->normalizedCoords;
  fVar10 = coords->t;
  iVar4 = Vector<int,_3>::y(&prec->coordBits);
  iVar5 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI,(bool)(bVar3 & 1),dim,fVar10,iVar4,iVar5);
  fVar10 = Vector<float,_2>::x(&vBounds);
  dVar6 = ::deFloorFloatToInt32(fVar10 - 0.5);
  fVar10 = Vector<float,_2>::y(&vBounds);
  dVar7 = ::deFloorFloatToInt32(fVar10 - 0.5);
  fVar10 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
  faces[5].m_data._4_4_ = ::deFloorFloatToInt32(fVar10 - 0.5);
  fVar10 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
  faces[5].m_data._0_4_ = ::deFloorFloatToInt32(fVar10 - 0.5);
  local_270 = (ConstPixelBufferAccess *)&j;
  do {
    ConstPixelBufferAccess::ConstPixelBufferAccess(local_270);
    local_270 = local_270 + 1;
  } while (local_270 != (ConstPixelBufferAccess *)&faces[5].m_data);
  for (i = 0; i < 6; i = i + 1) {
    pCVar8 = TextureCubeView::getLevelFace(texture,levelNdx,i);
    memcpy(&j + (long)i * 10,pCVar8,0x28);
  }
  c00.t = faces[5].m_data._4_4_;
  do {
    c00.s = dVar6;
    if ((deInt32)faces[5].m_data < c00.t) {
      return false;
    }
    for (; c00.s <= dVar7; c00.s = c00.s + 1) {
      CVar1 = coords->face;
      Vector<int,_2>::Vector(&local_184,c00.s,c00.t);
      CubeFaceCoords<int>::CubeFaceCoords(&local_17c,CVar1,&local_184);
      join_0x00000010_0x00000000_ = remapCubeEdgeCoords(&local_17c,dim);
      c00.face = local_190;
      local_170 = stack0xfffffffffffffe68;
      CVar1 = coords->face;
      Vector<int,_2>::Vector(&local_1bc,c00.s + 1,c00.t);
      CubeFaceCoords<int>::CubeFaceCoords(&local_1b4,CVar1,&local_1bc);
      join_0x00000010_0x00000000_ = remapCubeEdgeCoords(&local_1b4,dim);
      c10.face = local_1c8;
      local_1a8 = stack0xfffffffffffffe30;
      CVar1 = coords->face;
      Vector<int,_2>::Vector(&local_1f4,c00.s,c00.t + 1);
      CubeFaceCoords<int>::CubeFaceCoords(&local_1ec,CVar1,&local_1f4);
      CVar13 = remapCubeEdgeCoords(&local_1ec,dim);
      local_200 = CVar13.t;
      c01.face = local_200;
      c11._4_8_ = CVar13._0_8_;
      local_1e0._0_4_ = c11.s;
      local_1e0._4_4_ = c11.t;
      CVar1 = coords->face;
      unique0x1000066d = CVar13;
      Vector<int,_2>::Vector(&local_228,c00.s + 1,c00.t + 1);
      CubeFaceCoords<int>::CubeFaceCoords(&local_220,CVar1,&local_228);
      CVar13 = remapCubeEdgeCoords(&local_220,dim);
      _maxA = CVar13._0_8_;
      local_214 = _maxA;
      uVar2 = local_214;
      local_230 = CVar13.t;
      c11.face = local_230;
      if (((((int)local_170 == 6) || ((int)local_1e0 == 6)) || ((int)local_1a8 == 6)) ||
         (local_214._0_4_ = CVar13.face, (CubeFace)local_214 == CUBEFACE_LAST)) {
        return true;
      }
      local_214 = uVar2;
      fVar10 = Vector<float,_2>::x(&vBounds);
      fVar10 = de::clamp<float>((fVar10 - 0.5) - (float)c00.s,0.0,1.0);
      fVar11 = Vector<float,_2>::y(&vBounds);
      fVar11 = de::clamp<float>((fVar11 - 0.5) - (float)c00.s,0.0,1.0);
      fVar12 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
      depths.m_data[3] = de::clamp<float>((fVar12 - 0.5) - (float)c00.t,0.0,1.0);
      fVar12 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
      depths.m_data[2] = de::clamp<float>((fVar12 - 0.5) - (float)c00.t,0.0,1.0);
      Vector<float,_4>::Vector((Vector<float,_4> *)local_258);
      fVar12 = lookupDepthNoBorder((ConstPixelBufferAccess *)(&j + (local_170 & 0xffffffff) * 10),
                                   sampler,local_170._4_4_,c00.face,0);
      pfVar9 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_258,0);
      *pfVar9 = fVar12;
      fVar12 = lookupDepthNoBorder((ConstPixelBufferAccess *)(&j + (local_1a8 & 0xffffffff) * 10),
                                   sampler,local_1a8._4_4_,c10.face,0);
      pfVar9 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_258,1);
      *pfVar9 = fVar12;
      fVar12 = lookupDepthNoBorder((ConstPixelBufferAccess *)(&j + (local_1e0 & 0xffffffff) * 10),
                                   sampler,local_1e0._4_4_,c01.face,0);
      pfVar9 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_258,2);
      *pfVar9 = fVar12;
      fVar12 = lookupDepthNoBorder((ConstPixelBufferAccess *)(&j + (local_214 & 0xffffffff) * 10),
                                   sampler,local_214._4_4_,c11.face,0);
      pfVar9 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_258,3);
      *pfVar9 = fVar12;
      compareMode = sampler->compare;
      Vector<float,_2>::Vector(&local_260,fVar10,fVar11);
      Vector<float,_2>::Vector(&local_268,depths.m_data[3],depths.m_data[2]);
      bVar3 = isBilinearCompareValid
                        (compareMode,prec,(Vec4 *)local_258,&local_260,&local_268,cmpReference,
                         result,isFixedPointDepth_00);
      if (bVar3) {
        return true;
      }
    }
    c00.t = c00.t + 1;
  } while( true );
}

Assistant:

static bool isSeamlessLinearCompareResultValid (const TextureCubeView&		texture,
												const int					levelNdx,
												const Sampler&				sampler,
												const TexComparePrecision&	prec,
												const CubeFaceFloatCoords&	coords,
												const float					cmpReference,
												const float					result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(texture.getLevelFace(levelNdx, CUBEFACE_NEGATIVE_X).getFormat());
	const int	size				= texture.getLevelFace(levelNdx, coords.face).getWidth();

	const Vec2	uBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, size, coords.s, prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, size, coords.t, prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0,y0) - without wrap mode
	const int	minI				= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int	maxI				= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int	minJ				= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int	maxJ				= deFloorFloatToInt32(vBounds.y()-0.5f);

	// Face accesses
	ConstPixelBufferAccess faces[CUBEFACE_LAST];
	for (int face = 0; face < CUBEFACE_LAST; face++)
		faces[face] = texture.getLevelFace(levelNdx, CubeFace(face));

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			const CubeFaceIntCoords	c00	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i+0, j+0)), size);
			const CubeFaceIntCoords	c10	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i+1, j+0)), size);
			const CubeFaceIntCoords	c01	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i+0, j+1)), size);
			const CubeFaceIntCoords	c11	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i+1, j+1)), size);

			// If any of samples is out of both edges, implementations can do pretty much anything according to spec.
			// \todo [2013-07-08 pyry] Test the special case where all corner pixels have exactly the same color.
			if (c00.face == CUBEFACE_LAST || c01.face == CUBEFACE_LAST || c10.face == CUBEFACE_LAST || c11.face == CUBEFACE_LAST)
				return true;

			// Bounds for filtering factors
			const float	minA	= de::clamp((uBounds.x()-0.5f)-float(i), 0.0f, 1.0f);
			const float	maxA	= de::clamp((uBounds.y()-0.5f)-float(i), 0.0f, 1.0f);
			const float	minB	= de::clamp((vBounds.x()-0.5f)-float(j), 0.0f, 1.0f);
			const float	maxB	= de::clamp((vBounds.y()-0.5f)-float(j), 0.0f, 1.0f);

			Vec4 depths;
			depths[0] = lookupDepthNoBorder(faces[c00.face], sampler, c00.s, c00.t);
			depths[1] = lookupDepthNoBorder(faces[c10.face], sampler, c10.s, c10.t);
			depths[2] = lookupDepthNoBorder(faces[c01.face], sampler, c01.s, c01.t);
			depths[3] = lookupDepthNoBorder(faces[c11.face], sampler, c11.s, c11.t);

			if (isBilinearCompareValid(sampler.compare, prec, depths, Vec2(minA, maxA), Vec2(minB, maxB), cmpReference, result, isFixedPointDepth))
				return true;
		}
	}

	return false;
}